

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall
adios2sys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,bool *variable,string *value)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = std::operator==(value,"1");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(value,"ON");
    if (!bVar1) {
      bVar1 = std::operator==(value,"on");
      if (!bVar1) {
        bVar1 = std::operator==(value,"On");
        if (!bVar1) {
          bVar1 = std::operator==(value,"TRUE");
          if (!bVar1) {
            bVar1 = std::operator==(value,"true");
            if (!bVar1) {
              bVar1 = std::operator==(value,"True");
              if (!bVar1) {
                bVar1 = std::operator==(value,"yes");
                if (!bVar1) {
                  bVar1 = std::operator==(value,"Yes");
                  if (!bVar1) {
                    bVar2 = std::operator==(value,"YES");
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *variable = bVar2;
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(bool* variable,
                                            const std::string& value)
{
  if (value == "1" || value == "ON" || value == "on" || value == "On" ||
      value == "TRUE" || value == "true" || value == "True" ||
      value == "yes" || value == "Yes" || value == "YES") {
    *variable = true;
  } else {
    *variable = false;
  }
}